

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

bool __thiscall QGraphicsProxyWidget::event(QGraphicsProxyWidget *this,QEvent *event)

{
  QPointer<QWidget> *this_00;
  ushort uVar1;
  long lVar2;
  QGraphicsProxyWidgetPrivate *this_01;
  Data *pDVar3;
  QWidgetPrivate *pQVar4;
  bool bVar5;
  char cVar6;
  QEvent QVar7;
  uint uVar8;
  QWidget *pQVar9;
  ulong uVar10;
  QWidget *pQVar11;
  QStyle *style;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  QPointF local_60;
  QPointF local_50;
  QPoint pos;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  this_00 = &this_01->widget;
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      bVar5 = QGraphicsWidget::event((QGraphicsWidget *)this,event);
      return bVar5;
    }
    goto LAB_0058f16a;
  }
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0xc2 < 3) {
    pDVar3 = (this_00->wp).d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar9 = (QWidget *)0x0;
    }
    else {
      pQVar9 = (QWidget *)(this_01->widget).wp.value;
    }
    bVar5 = QApplicationPrivate::translateRawTouchEvent(pQVar9,(QTouchEvent *)event);
    if ((bVar5) && (QVar7 = (QEvent)0x1, event[0xc] != (QEvent)0x0)) goto LAB_0058f143;
LAB_0058f136:
    QVar7 = (QEvent)QGraphicsWidget::event((QGraphicsWidget *)this,event);
  }
  else {
    if (uVar1 - 0x18 < 2) {
      pDVar3 = (this_00->wp).d;
      if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
        pQVar12 = (QObject *)0x0;
      }
      else {
        pQVar12 = (this_01->widget).wp.value;
      }
      QCoreApplication::sendEvent(pQVar12,event);
      goto LAB_0058f136;
    }
    if (uVar1 == 6) {
      if ((*(int *)(event + 0x40) + 0xfeffffffU < 2) &&
         (uVar10 = QKeyEvent::modifiers(), (uVar10 & 0xc000000) == 0)) {
        pQVar9 = QWidget::focusWidget((QWidget *)(this_01->widget).wp.value);
        QVar7 = (QEvent)0x1;
        for (; pQVar9 != (QWidget *)0x0; pQVar9 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10))
        {
          cVar6 = QCoreApplication::sendEvent(&pQVar9->super_QObject,event);
          if ((cVar6 != '\0') && (event[0xc] != (QEvent)0x0)) {
LAB_0058f164:
            event[0xc] = (QEvent)0x1;
            break;
          }
          bVar5 = QGraphicsItem::isWindow((QGraphicsItem *)(this + 0x10));
          if (bVar5) {
            pDVar3 = (this_00->wp).d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar11 = (QWidget *)0x0;
            }
            else {
              pQVar11 = (QWidget *)(this_01->widget).wp.value;
            }
            if (pQVar11 == pQVar9) goto LAB_0058f164;
          }
        }
        goto LAB_0058f143;
      }
      goto LAB_0058f136;
    }
    if (uVar1 == 0x27) {
      pQVar4 = *(QWidgetPrivate **)((this_01->widget).wp.value + 8);
      uVar8 = QPalette::resolveMask();
      pQVar4->inheritedPaletteResolveMask =
           (long)(int)(uVar8 | (this_01->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      QWidgetPrivate::resolvePalette(pQVar4);
      goto LAB_0058f136;
    }
    if (uVar1 == 0x33) {
      pQVar9 = QWidget::focusWidget((QWidget *)(this_01->widget).wp.value);
      while ((QVar7 = (QEvent)(pQVar9 != (QWidget *)0x0), (bool)QVar7 &&
             (QCoreApplication::sendEvent(&pQVar9->super_QObject,event), event[0xc] == (QEvent)0x0))
            ) {
        pQVar9 = *(QWidget **)(*(long *)&pQVar9->field_0x8 + 0x10);
      }
    }
    else {
      if (uVar1 != 0x53) {
        if (uVar1 == 0x61) {
          pQVar4 = *(QWidgetPrivate **)((this_01->widget).wp.value + 8);
          pQVar4->inheritedFontResolveMask =
               (this_01->super_QGraphicsWidgetPrivate).inheritedFontResolveMask |
               *(uint *)&(this_01->super_QGraphicsWidgetPrivate).field_0x1a8;
          QWidgetPrivate::resolveFont(pQVar4);
        }
        else if (uVar1 == 100) {
          if ((*(ushort *)&this_01->field_0x244 & 0x300) == 0) {
            *(ushort *)&this_01->field_0x244 = *(ushort *)&this_01->field_0x244 | 0x100;
            pDVar3 = (this_01->widget).wp.d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar9 = (QWidget *)0x0;
            }
            else {
              pQVar9 = (QWidget *)(this_01->widget).wp.value;
            }
            style = QGraphicsWidget::style((QGraphicsWidget *)this);
            QWidget::setStyle(pQVar9,style);
            this_01->field_0x245 = this_01->field_0x245 & 0xfc;
          }
        }
        else if (uVar1 == 0xa3) {
          bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_01->lastWidgetUnderMouse);
          if (bVar5) {
            pos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QVar13 = QGraphicsSceneHelpEvent::scenePos((QGraphicsSceneHelpEvent *)event);
            local_60.yp = QVar13.yp;
            local_60.xp = QVar13.xp;
            QVar13 = QGraphicsItem::mapFromScene((QGraphicsItem *)(this + 0x10),&local_60);
            local_50.yp = QVar13.yp;
            local_50.xp = QVar13.xp;
            pDVar3 = (this_01->lastWidgetUnderMouse).wp.d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar9 = (QWidget *)0x0;
            }
            else {
              pQVar9 = (QWidget *)(this_01->lastWidgetUnderMouse).wp.value;
            }
            QVar13 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_01,&local_50,pQVar9);
            local_88._8_8_ = QVar13.yp;
            local_88._0_8_ = QVar13.xp;
            pos = QPointF::toPoint((QPointF *)local_88);
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_50.xp = (qreal)QGraphicsSceneHelpEvent::screenPos
                                           ((QGraphicsSceneHelpEvent *)event);
            QHelpEvent::QHelpEvent((QHelpEvent *)local_88,ToolTip,&pos,(QPoint *)&local_50);
            pDVar3 = (this_01->lastWidgetUnderMouse).wp.d;
            if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
              pQVar12 = (QObject *)0x0;
            }
            else {
              pQVar12 = (this_01->lastWidgetUnderMouse).wp.value;
            }
            QCoreApplication::sendEvent(pQVar12,(QEvent *)local_88);
            (**(code **)(*(long *)event + 0x10))(event,local_88[0xc]);
            QVar7 = local_88[0xc];
            QHelpEvent::~QHelpEvent((QHelpEvent *)local_88);
            goto LAB_0058f143;
          }
        }
        else if ((uVar1 == 0xb8) && ((*(ushort *)&this_01->field_0x244 & 0x3000) == 0)) {
          *(ushort *)&this_01->field_0x244 = *(ushort *)&this_01->field_0x244 | 0x1000;
          pDVar3 = (this_01->widget).wp.d;
          if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
            pQVar9 = (QWidget *)0x0;
          }
          else {
            pQVar9 = (QWidget *)(this_01->widget).wp.value;
          }
          QGraphicsItem::toolTip((QString *)local_88,(QGraphicsItem *)(this + 0x10));
          QWidget::setToolTip(pQVar9,(QString *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          this_01->field_0x245 = this_01->field_0x245 & 0xcf;
        }
        goto LAB_0058f136;
      }
      (**(code **)(*(long *)this + 0x1c8))(this,event);
      QVar7 = event[0xc];
    }
  }
LAB_0058f143:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)QVar7;
  }
LAB_0058f16a:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsProxyWidget::event(QEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget)
        return QGraphicsWidget::event(event);

    switch (event->type()) {
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        QCoreApplication::sendEvent(d->widget, event);
        break;
    case QEvent::StyleChange:
        // Propagate style changes to the embedded widget.
        if (!d->styleChangeMode) {
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setStyle(style());
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    case QEvent::FontChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->font.resolveMask() | d->inheritedFontResolveMask;
        wd->inheritedFontResolveMask = mask;
        wd->resolveFont();
        break;
    }
    case QEvent::PaletteChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->palette.resolveMask() | d->inheritedPaletteResolveMask;
        wd->inheritedPaletteResolveMask = mask;
        wd->resolvePalette();
        break;
    }
    case QEvent::InputMethod: {
        inputMethodEvent(static_cast<QInputMethodEvent *>(event));
        if (event->isAccepted())
            return true;
        return false;
    }
    case QEvent::ShortcutOverride: {
        QWidget *focusWidget = d->widget->focusWidget();
        while (focusWidget) {
            QCoreApplication::sendEvent(focusWidget, event);
            if (event->isAccepted())
                return true;
            focusWidget = focusWidget->parentWidget();
        }
        return false;
    }
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        if (k->key() == Qt::Key_Tab || k->key() == Qt::Key_Backtab) {
            if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
                QWidget *focusWidget = d->widget->focusWidget();
                while (focusWidget) {
                    const bool res = QCoreApplication::sendEvent(focusWidget, event);
                    if ((res && event->isAccepted()) || (isWindow() && focusWidget == d->widget)) {
                        event->accept();
                        break;
                    }
                    focusWidget = focusWidget->parentWidget();
                }
                return true;
            }
        }
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::GraphicsSceneHelp: {
        // Propagate the help event (for tooltip) to the widget under mouse
        if (d->lastWidgetUnderMouse) {
            QGraphicsSceneHelpEvent *he = static_cast<QGraphicsSceneHelpEvent *>(event);
            QPoint pos = d->mapToReceiver(mapFromScene(he->scenePos()), d->lastWidgetUnderMouse).toPoint();
            QHelpEvent e(QEvent::ToolTip, pos, he->screenPos());
            QCoreApplication::sendEvent(d->lastWidgetUnderMouse, &e);
            event->setAccepted(e.isAccepted());
            return e.isAccepted();
        }
        break;
    }
    case QEvent::ToolTipChange: {
        // Propagate tooltip change to the widget
        if (!d->tooltipChangeMode) {
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setToolTip(toolTip());
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    }
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd: {
        QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
        bool res = QApplicationPrivate::translateRawTouchEvent(d->widget, touchEvent);
        if (res & touchEvent->isAccepted())
            return true;

        break;
    }
    default:
        break;
    }
    return QGraphicsWidget::event(event);
}